

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O2

vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
* __thiscall
backend::codegen::RegAllocator::sort_intervals
          (vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
           *__return_storage_ptr__,RegAllocator *this)

{
  long lVar1;
  pointer ppVar2;
  pointer ppVar3;
  ulong uVar4;
  __normal_iterator<std::pair<unsigned_int,_backend::codegen::Interval>_*,_std::vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>_>
  __i;
  long lVar5;
  pointer ppVar6;
  __node_base *p_Var7;
  vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  intervals;
  pair<unsigned_int,_backend::codegen::Interval> local_2c;
  
  intervals.
  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  intervals.
  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  intervals.
  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ::reserve(&intervals,(this->live_intervals)._M_h._M_element_count);
  p_Var7 = &(this->live_intervals)._M_h._M_before_begin;
  while (ppVar3 = intervals.
                  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        ppVar2 = intervals.
                 super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, p_Var7 = p_Var7->_M_nxt,
        p_Var7 != (__node_base *)0x0) {
    local_2c.first = (uint)*(size_type *)(p_Var7 + 1);
    local_2c.second = *(Interval *)((long)(p_Var7 + 1) + 4);
    std::
    vector<std::pair<unsigned_int,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int,backend::codegen::Interval>>>
    ::emplace_back<std::pair<unsigned_int,backend::codegen::Interval>>
              ((vector<std::pair<unsigned_int,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int,backend::codegen::Interval>>>
                *)&intervals,&local_2c);
  }
  if (intervals.
      super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      intervals.
      super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar5 = (long)intervals.
                  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)intervals.
                  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = lVar5 / 0xc;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,backend::codegen::Interval>*,std::vector<std::pair<unsigned_int,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int,backend::codegen::Interval>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<backend::codegen::RegAllocator::sort_intervals()::__0>>
              (intervals.
               super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               intervals.
               super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar5 < 0xc1) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,backend::codegen::Interval>*,std::vector<std::pair<unsigned_int,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int,backend::codegen::Interval>>>>,__gnu_cxx::__ops::_Iter_comp_iter<backend::codegen::RegAllocator::sort_intervals()::__0>>
                (ppVar2,ppVar3);
    }
    else {
      ppVar6 = ppVar2 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,backend::codegen::Interval>*,std::vector<std::pair<unsigned_int,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int,backend::codegen::Interval>>>>,__gnu_cxx::__ops::_Iter_comp_iter<backend::codegen::RegAllocator::sort_intervals()::__0>>
                (ppVar2,ppVar6);
      for (; ppVar6 != ppVar3; ppVar6 = ppVar6 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,backend::codegen::Interval>*,std::vector<std::pair<unsigned_int,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int,backend::codegen::Interval>>>>,__gnu_cxx::__ops::_Val_comp_iter<backend::codegen::RegAllocator::sort_intervals()::__0>>
                  (ppVar6);
      }
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       intervals.
       super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       intervals.
       super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       intervals.
       super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  intervals.
  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  intervals.
  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  intervals.
  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ::~_Vector_base(&intervals.
                   super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<Reg, Interval>> RegAllocator::sort_intervals() {
  //   Initialize vector
  std::vector<std::pair<Reg, Interval>> intervals;
  intervals.reserve(live_intervals.size());
  for (auto interval_pair : live_intervals) {
    intervals.push_back(interval_pair);
  }
  //   sort by interval starting point
  std::sort(intervals.begin(), intervals.end(), [](auto &first, auto &second) {
    return first.second.start < second.second.start;
  });

  return std::move(intervals);
}